

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O3

void __thiscall UEFITool::openImageFile(UEFITool *this,QString *path)

{
  QString *pQVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  char cVar5;
  USTATUS errorCode;
  FfsFinder *pFVar6;
  FfsOperations *pFVar7;
  FfsReport *pFVar8;
  QFile *ctx;
  longlong lVar9;
  QByteArray buffer;
  QFileInfo fileInfo;
  QFile inputFile;
  QArrayData *local_a8;
  char16_t *pcStack_a0;
  qsizetype local_98;
  QByteArray local_90;
  QString local_78;
  QFileInfo local_60 [8];
  QArrayData *local_58 [3];
  QFile local_40 [16];
  QArrayData *local_30 [3];
  
  QString::trimmed_helper((QString *)&local_90);
  if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,8);
    }
  }
  if (local_90.d.size == 0) {
    return;
  }
  QFileInfo::QFileInfo(local_60,(QString *)path);
  cVar5 = QFileInfo::exists();
  if (cVar5 == '\0') {
    pQVar1 = *(QString **)(this->ui + 0x1d8);
    QMetaObject::tr((char *)&local_90,(char *)&staticMetaObject,0x1d2e60);
    QStatusBar::showMessage(pQVar1,(int)&local_90);
    if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,8);
      }
    }
    goto LAB_0012b686;
  }
  QFile::QFile(local_40);
  QFile::setFileName((QString *)local_40);
  cVar5 = QFile::open(local_40,1);
  if (cVar5 == '\0') {
    QMetaObject::tr((char *)&local_90,(char *)&staticMetaObject,0x1d2e7c);
    QMetaObject::tr((char *)&local_a8,(char *)&staticMetaObject,0x1d2e91);
    QMessageBox::critical(this,&local_90,&local_a8,0x400,0);
    if (local_a8 != (QArrayData *)0x0) {
      LOCK();
      (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_a8,2,8);
      }
    }
    if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        lVar9 = 2;
        goto LAB_0012b672;
      }
    }
  }
  else {
    ctx = local_40;
    QIODevice::readAll();
    QFileDevice::close();
    init(this,(EVP_PKEY_CTX *)ctx);
    QMetaObject::tr((char *)local_58,(char *)&staticMetaObject,0x1d2eb3);
    QString::arg((QString *)&local_78,(int)local_58,(QChar)((short)this + L'à'));
    QFileInfo::fileName();
    QString::arg((QString *)&local_a8,(int)&local_78,(QChar)(char16_t)local_30);
    QWidget::setWindowTitle((QString *)this);
    if (local_a8 != (QArrayData *)0x0) {
      LOCK();
      (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_a8,2,8);
      }
    }
    if (local_30[0] != (QArrayData *)0x0) {
      LOCK();
      (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_30[0],2,8);
      }
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
      }
    }
    if (local_58[0] != (QArrayData *)0x0) {
      LOCK();
      (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58[0],2,8);
      }
    }
    errorCode = FfsParser::parse(this->ffsParser,&local_90);
    showParserMessages(this);
    if (errorCode == 0) {
      pQVar1 = *(QString **)(this->ui + 0x1d8);
      QMetaObject::tr((char *)&local_78,(char *)&staticMetaObject,0x1d2ec4);
      QFileInfo::fileName();
      QString::arg((QString *)&local_a8,(int)&local_78,(QChar)(char16_t)local_58);
      QStatusBar::showMessage(pQVar1,(int)&local_a8);
      if (local_a8 != (QArrayData *)0x0) {
        LOCK();
        (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_a8,2,8);
        }
      }
      if (local_58[0] != (QArrayData *)0x0) {
        LOCK();
        (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_58[0],2,8);
        }
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
        }
      }
      FfsParser::outputInfo(this->ffsParser);
      showFitTable(this);
      showSecurityInfo(this);
      pFVar6 = this->ffsFinder;
      if (pFVar6 != (FfsFinder *)0x0) {
        std::
        vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>::
        ~vector(&pFVar6->messagesVector);
      }
      operator_delete(pFVar6,0x20);
      pFVar6 = (FfsFinder *)operator_new(0x20);
      pFVar6->model = this->model;
      (pFVar6->messagesVector).
      super__Vector_base<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pFVar6->messagesVector).
      super__Vector_base<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pFVar6->messagesVector).
      super__Vector_base<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this->ffsFinder = pFVar6;
      QAction::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x68),0));
      pFVar7 = this->ffsOps;
      if (pFVar7 != (FfsOperations *)0x0) {
        std::
        vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>::
        ~vector(&pFVar7->messagesVector);
      }
      operator_delete(pFVar7,0x20);
      pFVar7 = (FfsOperations *)operator_new(0x20);
      pFVar7->model = this->model;
      (pFVar7->messagesVector).
      super__Vector_base<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pFVar7->messagesVector).
      super__Vector_base<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pFVar7->messagesVector).
      super__Vector_base<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this->ffsOps = pFVar7;
      operator_delete(this->ffsReport,8);
      pFVar8 = (FfsReport *)operator_new(8);
      pFVar8->model = this->model;
      this->ffsReport = pFVar8;
      QAction::setEnabled(SUB81(*(undefined8 *)(this->ui + 0xb0),0));
      if (*(int *)((long)&this->ffsParser->addressDiff + 4) == 0) {
        QAction::setEnabled(SUB81(*(undefined8 *)(this->ui + 0xd0),0));
      }
      QAction::setEnabled(SUB81(*(undefined8 *)(this->ui + 0xe0),0));
      QAction::setEnabled(SUB81(*(undefined8 *)(this->ui + 0xf8),0));
      QFileInfo::absolutePath();
      pQVar2 = &((this->currentDir).d.d)->super_QArrayData;
      pcVar3 = (this->currentDir).d.ptr;
      (this->currentDir).d.d = (Data *)local_a8;
      (this->currentDir).d.ptr = pcStack_a0;
      qVar4 = (this->currentDir).d.size;
      (this->currentDir).d.size = local_98;
      local_a8 = pQVar2;
      pcStack_a0 = pcVar3;
      local_98 = qVar4;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,8);
        }
      }
      QString::operator=(&this->currentPath,(QString *)path);
    }
    else {
      QMetaObject::tr((char *)&local_a8,(char *)&staticMetaObject,0x1d2e7c);
      errorCodeToUString(&local_78,errorCode);
      QMessageBox::critical(this,&local_a8,&local_78,0x400,0);
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
        }
      }
      if (local_a8 != (QArrayData *)0x0) {
        LOCK();
        (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_a8,2,8);
        }
      }
    }
    if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        lVar9 = 1;
LAB_0012b672:
        QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,lVar9,8);
      }
    }
  }
  QFile::~QFile(local_40);
LAB_0012b686:
  QFileInfo::~QFileInfo(local_60);
  return;
}

Assistant:

void UEFITool::openImageFile(QString path)
{
    if (path.trimmed().isEmpty())
        return;
    
    QFileInfo fileInfo = QFileInfo(path);
    
    if (!fileInfo.exists()) {
        ui->statusBar->showMessage(tr("Please select existing file"));
        return;
    }
    
    QFile inputFile;
    inputFile.setFileName(path);
    
    if (!inputFile.open(QFile::ReadOnly)) {
        QMessageBox::critical(this, tr("Image parsing failed"), tr("Can't open input file for reading"), QMessageBox::Ok);
        return;
    }
    
    QByteArray buffer = inputFile.readAll();
    inputFile.close();
    
    init();
    setWindowTitle(tr("UEFITool %1 - %2").arg(version).arg(fileInfo.fileName()));
    
    // Parse the image
    USTATUS result = ffsParser->parse(buffer);
    showParserMessages();
    if (result) {
        QMessageBox::critical(this, tr("Image parsing failed"), errorCodeToUString(result), QMessageBox::Ok);
        return;
    }
    else {
        ui->statusBar->showMessage(tr("Opened: %1").arg(fileInfo.fileName()));
    }
    ffsParser->outputInfo();
    
    // Enable or disable FIT tab
    showFitTable();
    
    // Enable or disable Security tab
    showSecurityInfo();
    
    // Enable search ...
    delete ffsFinder;
    ffsFinder = new FfsFinder(model);
    ui->actionSearch->setEnabled(true);
    // ... and other operations
    delete ffsOps;
    ffsOps = new FfsOperations(model);
    // ... and reports
    delete ffsReport;
    ffsReport = new FfsReport(model);
    
    // Enable goToBase and goToAddress
    ui->actionGoToBase->setEnabled(true);
    if (ffsParser->getAddressDiff() <= 0xFFFFFFFFUL)
        ui->actionGoToAddress->setEnabled(true);
    
    // Enable generateReport
    ui->actionGenerateReport->setEnabled(true);
    
    // Enable saving GUIDs
    ui->actionExportDiscoveredGuids->setEnabled(true);
    
    // Set current directory
    currentDir = fileInfo.absolutePath();
    
    // Set current path
    currentPath = path;
}